

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowCodeInit(Parse *pParse,Window *pMWin)

{
  Expr *pEVar1;
  int iVar2;
  Vdbe *pVVar3;
  Parse *in_RSI;
  long in_RDI;
  KeyInfo *pKeyInfo;
  ExprList *pList;
  FuncDef *p;
  int nPart;
  Vdbe *v;
  Window *pWin;
  undefined4 in_stack_ffffffffffffffb8;
  int p1;
  undefined4 in_stack_ffffffffffffffbc;
  int op;
  Vdbe *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  void *pP4;
  undefined8 in_stack_ffffffffffffffd0;
  Vdbe *p_00;
  undefined4 in_stack_ffffffffffffffd8;
  Parse *pParse_00;
  
  pVVar3 = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (((ExprList_item *)&in_RSI->zErrMsg)->pExpr == (Expr *)0x0) {
    op = 0;
  }
  else {
    pEVar1 = ((ExprList_item *)&in_RSI->zErrMsg)->pExpr;
    op._0_1_ = pEVar1->op;
    op._1_1_ = pEVar1->affinity;
    op._2_2_ = *(undefined2 *)&pEVar1->field_0x2;
  }
  if (in_RSI->pVdbe == (Vdbe *)0x0) {
    p1 = 0;
  }
  else {
    p1 = *(int *)&in_RSI->pVdbe->db;
  }
  iVar2 = p1 + op;
  pParse_00 = in_RSI;
  if (iVar2 != 0) {
    *(int *)((long)&in_RSI->pConstExpr + 4) = *(int *)(in_RDI + 0x38) + 1;
    *(int *)(in_RDI + 0x38) = iVar2 + *(int *)(in_RDI + 0x38);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),
                      (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0
                      ,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                      (int)in_stack_ffffffffffffffc8);
    pParse_00 = in_RSI;
  }
  for (; in_RSI != (Parse *)0x0; in_RSI = *(Parse **)&in_RSI->nErr) {
    p_00 = *(Vdbe **)&in_RSI->szOpAlloc;
    if ((((ulong)p_00->db & 0x100000000000) == 0) || (*(char *)((long)&in_RSI->rc + 1) == 'W')) {
      if ((*(char **)&p_00->rc == "nth_value") || (*(char **)&p_00->rc == "first_value")) {
        *(int *)&in_RSI->pConstExpr = *(int *)(in_RDI + 0x38) + 1;
        iVar2 = *(int *)(in_RDI + 0x34);
        *(int *)(in_RDI + 0x34) = iVar2 + 1;
        *(int *)((long)&in_RSI->aLabel + 4) = iVar2;
        *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 2;
        sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,op,p1,0);
      }
      else if ((*(char **)&p_00->rc == "lead") || (*(char **)&p_00->rc == "lag")) {
        iVar2 = *(int *)(in_RDI + 0x34);
        *(int *)(in_RDI + 0x34) = iVar2 + 1;
        *(int *)((long)&in_RSI->aLabel + 4) = iVar2;
        sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,op,p1,0);
      }
    }
    else {
      pP4 = *(void **)((in_RSI->constraintName).z + 0x20);
      in_stack_ffffffffffffffc0 =
           (Vdbe *)sqlite3KeyInfoFromExprList
                             (pParse_00,(ExprList *)in_RSI,(int)((ulong)pVVar3 >> 0x20),(int)pVVar3)
      ;
      iVar2 = *(int *)(in_RDI + 0x34);
      *(int *)(in_RDI + 0x34) = iVar2 + 1;
      *(int *)((long)&in_RSI->aLabel + 4) = iVar2;
      *(int *)&in_RSI->pConstExpr = *(int *)(in_RDI + 0x38) + 1;
      *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 3;
      if ((in_stack_ffffffffffffffc0 != (Vdbe *)0x0) &&
         (*(char *)(*(long *)(*(long *)&in_RSI->szOpAlloc + 0x38) + 1) == 'i')) {
        *(undefined1 *)&in_stack_ffffffffffffffc0->pParse->db = 1;
      }
      sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,op,p1,0);
      sqlite3VdbeAppendP4(p_00,pP4,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,op,p1,0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeInit(Parse *pParse, Window *pMWin){
  Window *pWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int nPart = (pMWin->pPartition ? pMWin->pPartition->nExpr : 0);
  nPart += (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);
  if( nPart ){
    pMWin->regPart = pParse->nMem+1;
    pParse->nMem += nPart;
    sqlite3VdbeAddOp3(v, OP_Null, 0, pMWin->regPart, pMWin->regPart+nPart-1);
  }

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *p = pWin->pFunc;
    if( (p->funcFlags & SQLITE_FUNC_MINMAX) && pWin->eStart!=TK_UNBOUNDED ){
      /* The inline versions of min() and max() require a single ephemeral
      ** table and 3 registers. The registers are used as follows:
      **
      **   regApp+0: slot to copy min()/max() argument to for MakeRecord
      **   regApp+1: integer value used to ensure keys are unique
      **   regApp+2: output of MakeRecord
      */
      ExprList *pList = pWin->pOwner->x.pList;
      KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pList, 0, 0);
      pWin->csrApp = pParse->nTab++;
      pWin->regApp = pParse->nMem+1;
      pParse->nMem += 3;
      if( pKeyInfo && pWin->pFunc->zName[1]=='i' ){
        assert( pKeyInfo->aSortOrder[0]==0 );
        pKeyInfo->aSortOrder[0] = 1;
      }
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pWin->csrApp, 2);
      sqlite3VdbeAppendP4(v, pKeyInfo, P4_KEYINFO);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pWin->regApp+1);
    }
    else if( p->zName==nth_valueName || p->zName==first_valueName ){
      /* Allocate two registers at pWin->regApp. These will be used to
      ** store the start and end index of the current frame.  */
      assert( pMWin->iEphCsr );
      pWin->regApp = pParse->nMem+1;
      pWin->csrApp = pParse->nTab++;
      pParse->nMem += 2;
      sqlite3VdbeAddOp2(v, OP_OpenDup, pWin->csrApp, pMWin->iEphCsr);
    }
    else if( p->zName==leadName || p->zName==lagName ){
      assert( pMWin->iEphCsr );
      pWin->csrApp = pParse->nTab++;
      sqlite3VdbeAddOp2(v, OP_OpenDup, pWin->csrApp, pMWin->iEphCsr);
    }
  }
}